

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

mu_Rect mu_layout_next(mu_Context *ctx)

{
  int *piVar1;
  int iVar2;
  mu_Style *pmVar3;
  int iVar4;
  mu_Vec2 *pmVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  
  iVar2 = (ctx->layout_stack).idx;
  piVar12 = (int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c + -4);
  pmVar3 = ctx->style;
  iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].next_type;
  if (iVar9 == 0) {
    iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].items;
    iVar4 = (ctx->layout_stack).items[(long)iVar2 + -1].item_index;
    if (iVar4 == iVar9) {
      mu_layout_row(ctx,iVar4,(int *)0x0,(ctx->layout_stack).items[(long)iVar2 + -1].size.y);
      iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].items;
    }
    if (iVar9 < 1) {
      pmVar5 = &(ctx->layout_stack).items[(long)iVar2 + -1].size;
    }
    else {
      pmVar5 = (mu_Vec2 *)
               (piVar12 + (long)(ctx->layout_stack).items[(long)iVar2 + -1].item_index + 0xe);
    }
    iVar4 = pmVar5->x;
    iVar6 = (ctx->layout_stack).items[(long)iVar2 + -1].size.y;
    if (iVar4 == 0) {
      iVar4 = pmVar3->padding * 2 + (pmVar3->size).x;
    }
    if (iVar6 == 0) {
      iVar6 = pmVar3->padding * 2 + (pmVar3->size).y;
    }
    iVar8 = (ctx->layout_stack).items[(long)iVar2 + -1].position.x;
    if (iVar4 < 0) {
      iVar4 = (iVar4 - iVar8) + *(int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c + 4) + 1;
    }
    iVar7 = (ctx->layout_stack).items[(long)iVar2 + -1].position.y;
    if (iVar6 < 0) {
      iVar6 = (iVar6 - iVar7) + (ctx->layout_stack).items[(long)iVar2 + -1].body.h + 1;
    }
    piVar1 = &(ctx->layout_stack).items[(long)iVar2 + -1].item_index;
    *piVar1 = *piVar1 + 1;
    iVar9 = iVar8;
  }
  else {
    (ctx->layout_stack).items[(long)iVar2 + -1].next_type = 0;
    iVar8 = (ctx->layout_stack).items[(long)iVar2 + -1].next.x;
    iVar7 = (ctx->layout_stack).items[(long)iVar2 + -1].next.y;
    iVar4 = (ctx->layout_stack).items[(long)iVar2 + -1].next.w;
    iVar6 = (ctx->layout_stack).items[(long)iVar2 + -1].next.h;
    if (iVar9 == 2) goto LAB_0013a970;
    iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].position.x;
  }
  iVar11 = pmVar3->spacing;
  (ctx->layout_stack).items[(long)iVar2 + -1].position.x = iVar9 + iVar11 + iVar4;
  iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].next_row;
  iVar11 = iVar7 + iVar6 + iVar11;
  if (iVar11 < iVar9) {
    iVar11 = iVar9;
  }
  (ctx->layout_stack).items[(long)iVar2 + -1].next_row = iVar11;
  iVar8 = iVar8 + *piVar12;
  iVar7 = iVar7 + *(int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c);
  iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].max.x;
  iVar11 = (ctx->layout_stack).items[(long)iVar2 + -1].max.y;
  iVar10 = iVar8 + iVar4;
  if (iVar8 + iVar4 < iVar9) {
    iVar10 = iVar9;
  }
  (ctx->layout_stack).items[(long)iVar2 + -1].max.x = iVar10;
  iVar9 = iVar7 + iVar6;
  if (iVar7 + iVar6 < iVar11) {
    iVar9 = iVar11;
  }
  (ctx->layout_stack).items[(long)iVar2 + -1].max.y = iVar9;
LAB_0013a970:
  (ctx->last_rect).x = iVar8;
  (ctx->last_rect).y = iVar7;
  (ctx->last_rect).w = iVar4;
  (ctx->last_rect).h = iVar6;
  return ctx->last_rect;
}

Assistant:

mu_Rect mu_layout_next(mu_Context *ctx) {
  mu_Layout *layout = get_layout(ctx);
  mu_Style *style = ctx->style;
  mu_Rect res;

  if (layout->next_type) {
    /* handle rect set by `mu_layout_set_next` */
    int type = layout->next_type;
    layout->next_type = 0;
    res = layout->next;
    if (type == ABSOLUTE) { return (ctx->last_rect = res); }

  } else {
    /* handle next row */
    if (layout->item_index == layout->items) {
      mu_layout_row(ctx, layout->items, NULL, layout->size.y);
    }

    /* position */
    res.x = layout->position.x;
    res.y = layout->position.y;

    /* size */
    res.w = layout->items > 0 ? layout->widths[layout->item_index] : layout->size.x;
    res.h = layout->size.y;
    if (res.w == 0) { res.w = style->size.x + style->padding * 2; }
    if (res.h == 0) { res.h = style->size.y + style->padding * 2; }
    if (res.w <  0) { res.w += layout->body.w - res.x + 1; }
    if (res.h <  0) { res.h += layout->body.h - res.y + 1; }

    layout->item_index++;
  }

  /* update position */
  layout->position.x += res.w + style->spacing;
  layout->next_row = mu_max(layout->next_row, res.y + res.h + style->spacing);

  /* apply body offset */
  res.x += layout->body.x;
  res.y += layout->body.y;

  /* update max position */
  layout->max.x = mu_max(layout->max.x, res.x + res.w);
  layout->max.y = mu_max(layout->max.y, res.y + res.h);

  return (ctx->last_rect = res);
}